

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Signaler::Signal(Signaler *this)

{
  ostream *this_00;
  reference pvVar1;
  ssize_t sVar2;
  SystemException *this_01;
  int *piVar3;
  allocator local_39;
  string local_38 [39];
  undefined1 local_11;
  Signaler *pSStack_10;
  char byte;
  Signaler *this_local;
  
  local_11 = 0;
  pSStack_10 = this;
  this_00 = std::operator<<((ostream *)&std::clog,"Signal: Signaling!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  pvVar1 = std::array<int,_2UL>::operator[](&this->pipefd_,1);
  sVar2 = write(*pvVar1,&local_11,1);
  if (sVar2 != 1) {
    this_01 = (SystemException *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"write pipe",&local_39);
    piVar3 = __errno_location();
    SystemException::SystemException(this_01,(string *)local_38,*piVar3);
    __cxa_throw(this_01,&SystemException::typeinfo,SystemException::~SystemException);
  }
  return;
}

Assistant:

void Signal() {
            char byte = {};
            RESTINCURL_LOG_TRACE("Signal: Signaling!");
            if (write(pipefd_[FD_WRITE], &byte, 1) != 1) {
                throw SystemException("write pipe", errno);
            }
        }